

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

IsInstInlineCache * __thiscall Js::FunctionBody::GetIsInstInlineCache(FunctionBody *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  uchar *puVar5;
  uint uVar6;
  
  if ((this->inlineCaches).ptr == (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x18f5,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar2) goto LAB_0076d469;
    *puVar4 = 0;
  }
  uVar3 = GetCountField(this,IsInstInlineCacheCount);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x18f6,"(index < GetIsInstInlineCacheCount())",
                                "index < GetIsInstInlineCacheCount()");
    if (!bVar2) goto LAB_0076d469;
    *puVar4 = 0;
  }
  uVar3 = GetCountField(this,InlineCacheCount);
  uVar6 = uVar3 + index;
  puVar5 = (this->m_inlineCacheTypes).ptr;
  if ((puVar5[uVar6] & 0xfd) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x18fa,
                                "(this->m_inlineCacheTypes[index] == 0x00 || this->m_inlineCacheTypes[index] == 0x02)"
                                ,
                                "this->m_inlineCacheTypes[index] == InlineCacheTypeNone || this->m_inlineCacheTypes[index] == InlineCacheTypeIsInst"
                               );
    if (!bVar2) {
LAB_0076d469:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    puVar5 = (this->m_inlineCacheTypes).ptr;
  }
  puVar5[uVar6] = '\x02';
  return (IsInstInlineCache *)(this->inlineCaches).ptr[uVar6];
}

Assistant:

IsInstInlineCache *FunctionBody::GetIsInstInlineCache(uint index)
    {
        Assert(this->inlineCaches != nullptr);
        Assert(index < GetIsInstInlineCacheCount());
        index += this->GetInlineCacheCount();
#if DBG
        Assert(this->m_inlineCacheTypes[index] == InlineCacheTypeNone ||
            this->m_inlineCacheTypes[index] == InlineCacheTypeIsInst);
        this->m_inlineCacheTypes[index] = InlineCacheTypeIsInst;
#endif
        return reinterpret_cast<IsInstInlineCache *>(this->inlineCaches[index]);
    }